

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O0

int __thiscall
TPZFYsmpMatrix<std::complex<double>_>::Decompose_LU(TPZFYsmpMatrix<std::complex<double>_> *this)

{
  int64_t iVar1;
  long *plVar2;
  TPZBaseMatrix *in_RDI;
  int64_t colind;
  int64_t lastcol;
  int64_t neq;
  int64_t row;
  int64_t in_stack_000000b0;
  int64_t in_stack_000000b8;
  TPZFYsmpMatrix<std::complex<double>_> *in_stack_000000c0;
  int64_t local_28;
  long local_10;
  
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  for (local_10 = 1; local_10 < iVar1; local_10 = local_10 + 1) {
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 1),local_10 + 1);
    local_28 = 0;
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 2),*plVar2 + -1);
    if (local_10 <= *plVar2) {
      while (plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 2),local_28),
            *plVar2 < local_10) {
        TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 2),local_28);
        RowLUUpdate(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
        local_28 = local_28 + 1;
      }
    }
  }
  in_RDI->fDecomposed = '\x01';
  return 1;
}

Assistant:

int TPZFYsmpMatrix<TVar>::Decompose_LU()
{
    
#ifdef USING_MKL
    if(this->IsDecomposed() == ELU) return 1;
    if (this->IsDecomposed() != ENoDecompose) {
        DebugStop();
    }
	typename TPZPardisoSolver<TVar>::MStructure str =
        this->IsSymmetric() ?
		TPZPardisoSolver<TVar>::MStructure::ESymmetric:
		TPZPardisoSolver<TVar>::MStructure::ENonSymmetric;
	typename TPZPardisoSolver<TVar>::MSystemType sysType =
		this->IsSymmetric() ?
		TPZPardisoSolver<TVar>::MSystemType::ESymmetric:
		TPZPardisoSolver<TVar>::MSystemType::ENonSymmetric;
	typename TPZPardisoSolver<TVar>::MProperty prop =
		this->IsDefPositive() ?
		TPZPardisoSolver<TVar>::MProperty::EPositiveDefinite:
		TPZPardisoSolver<TVar>::MProperty::EIndefinite;
	fPardisoControl.SetStructure(str);
	fPardisoControl.SetMatrixType(sysType,prop);
    fPardisoControl.Decompose(this);
    this->SetIsDecomposed(ELU);
    return 1;
#endif
    
	int64_t row;
	int64_t neq = this->Rows();
	for(row=1; row<neq; row++)
	{
		//    int firstcol = fIA[row];
		int64_t lastcol = fIA[row+1];
		int64_t colind = 0;
		if(fJA[lastcol-1] < row) continue;
		while(fJA[colind] < row)
		{
			RowLUUpdate(fJA[colind],row);
			colind++;
		}
	}
	this->fDecomposed=1;
	return 1;
}